

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.hpp
# Opt level: O0

char * trial::protocol::json::detail::scan_whitespace<char>(char *marker,char *tail)

{
  bool bVar1;
  char *tail_local;
  char *marker_local;
  
  tail_local = marker;
  while ((tail_local != tail && (bVar1 = traits::is_space<char>(*tail_local), bVar1))) {
    tail_local = tail_local + 1;
  }
  return tail_local;
}

Assistant:

auto scan_whitespace(const CharT *marker,
                     const CharT * const tail) noexcept -> const CharT *
{
    while (marker != tail)
    {
        if (traits::is_space(*marker))
        {
            ++marker;
        }
        else
            break;
    }
    return marker;
}